

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_setNumFourOpsChn(ADL_MIDIPlayer *device,int ops4)

{
  uint uVar1;
  MIDIplay *this;
  bool bVar2;
  OPL3 *this_00;
  int iVar3;
  Synth *synth;
  allocator local_149;
  string local_148;
  char local_128 [8];
  char errBuff [250];
  MidiPlayer *play;
  int ops4_local;
  ADL_MIDIPlayer *device_local;
  
  if (device == (ADL_MIDIPlayer *)0x0) {
    device_local._4_4_ = -1;
  }
  else {
    unique0x00012000 = (MIDIplay *)device->adl_midiPlayer;
    if (unique0x00012000 == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x1b8,"int adl_setNumFourOpsChn(ADL_MIDIPlayer *, int)");
    }
    uVar1 = (unique0x00012000->m_setup).numChips;
    iVar3 = uVar1 * 6;
    if (ops4 == iVar3 || SBORROW4(ops4,iVar3) != (int)(ops4 + uVar1 * -6) < 0) {
      this_00 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*
                          (&unique0x00012000->m_synth);
      (stack0xffffffffffffffd8->m_setup).numFourOps = ops4;
      bVar2 = OPL3::setupLocked(this_00);
      if (!bVar2) {
        if ((stack0xffffffffffffffd8->m_setup).numFourOps < 0) {
          adlCalculateFourOpChannels(stack0xffffffffffffffd8,true);
        }
        else {
          this_00->m_numFourOps = (stack0xffffffffffffffd8->m_setup).numFourOps;
        }
        OPL3::updateChannelCategories(this_00);
      }
      device_local._4_4_ = 0;
    }
    else {
      snprintf(local_128,0xfa,
               "number of four-op channels may only be 0..%u when %u OPL3 cards are used.\n",
               (ulong)((unique0x00012000->m_setup).numChips * 6));
      this = stack0xffffffffffffffd8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,local_128,&local_149);
      MIDIplay::setErrorString(this,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      device_local._4_4_ = -1;
    }
  }
  return device_local._4_4_;
}

Assistant:

ADLMIDI_EXPORT int adl_setNumFourOpsChn(ADL_MIDIPlayer *device, int ops4)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    if(ops4 > 6 * static_cast<int>(play->m_setup.numChips))
    {
        char errBuff[250];
        snprintf(errBuff, 250, "number of four-op channels may only be 0..%u when %u OPL3 cards are used.\n", (6 * (play->m_setup.numChips)), play->m_setup.numChips);
        play->setErrorString(errBuff);
        return -1;
    }

    Synth &synth = *play->m_synth;
    play->m_setup.numFourOps = ops4;
    if(!synth.setupLocked())
    {
        if(play->m_setup.numFourOps < 0)
            adlCalculateFourOpChannels(play, true);
        else
            synth.m_numFourOps = static_cast<uint32_t>(play->m_setup.numFourOps);
        synth.updateChannelCategories();
    }

    return 0;
}